

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::TracingServiceImpl::EmitStats
          (TracingServiceImpl *this,TracingSession *tracing_session,
          vector<perfetto::TracePacket,_std::allocator<perfetto::TracePacket>_> *packets)

{
  RootMessage<perfetto::protos::pbzero::TracePacket> *this_00;
  Message *msg;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_1a8;
  HeapBuffered<perfetto::protos::pbzero::TracePacket> packet;
  TraceStats local_d0;
  
  protozero::HeapBuffered<perfetto::protos::pbzero::TracePacket>::HeapBuffered(&packet);
  this_00 = &packet.msg_;
  protos::pbzero::TracePacket::set_trusted_uid(&this_00->super_TracePacket,this->uid_);
  protos::pbzero::TracePacket::set_trusted_packet_sequence_id(&this_00->super_TracePacket,1);
  GetTraceStats(&local_d0,this,tracing_session);
  msg = &protos::pbzero::TracePacket::set_trace_stats<perfetto::protos::pbzero::TraceStats>
                   (&this_00->super_TracePacket)->super_Message;
  protos::gen::TraceStats::Serialize(&local_d0,msg);
  protos::gen::TraceStats::~TraceStats(&local_d0);
  protozero::HeapBuffered<perfetto::protos::pbzero::TracePacket>::SerializeAsArray
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&_Stack_1a8,&packet);
  anon_unknown_4::SerializeAndAppendPacket
            (packets,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&_Stack_1a8);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_1a8);
  protozero::MessageArena::~MessageArena(&packet.msg_.root_arena_);
  protozero::ScatteredStreamWriter::~ScatteredStreamWriter(&packet.writer_);
  protozero::ScatteredHeapBuffer::~ScatteredHeapBuffer(&packet.shb_);
  return;
}

Assistant:

void TracingServiceImpl::EmitStats(TracingSession* tracing_session,
                                   std::vector<TracePacket>* packets) {
  protozero::HeapBuffered<protos::pbzero::TracePacket> packet;
  packet->set_trusted_uid(static_cast<int32_t>(uid_));
  packet->set_trusted_packet_sequence_id(kServicePacketSequenceID);
  GetTraceStats(tracing_session).Serialize(packet->set_trace_stats());
  SerializeAndAppendPacket(packets, packet.SerializeAsArray());
}